

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall Catch::RunContext::handleFatalErrorCondition(RunContext *this,StringRef message)

{
  size_t *psVar1;
  IStreamingReporter *pIVar2;
  string local_3b0;
  string local_390;
  StringRef message_local;
  AssertionResultData tempResult;
  SectionInfo testCaseSection;
  undefined1 local_2b8 [304];
  Counts assertions;
  SectionStats testCaseSectionStats;
  Totals deltaTotals;
  AssertionResult result;
  
  message_local.m_size = message.m_size;
  message_local.m_start = message.m_start;
  (*((this->m_reporter)._M_t.
     super___uniq_ptr_impl<Catch::IStreamingReporter,_std::default_delete<Catch::IStreamingReporter>_>
     ._M_t.
     super__Tuple_impl<0UL,_Catch::IStreamingReporter_*,_std::default_delete<Catch::IStreamingReporter>_>
     .super__Head_base<0UL,_Catch::IStreamingReporter_*,_false>._M_head_impl)->
    _vptr_IStreamingReporter[0x10])();
  tempResult.message._M_dataplus._M_p = (pointer)&tempResult.message.field_2;
  tempResult.message._M_string_length = 0;
  tempResult.message.field_2._M_local_buf[0] = '\0';
  tempResult.reconstructedExpression._M_dataplus._M_p =
       (pointer)&tempResult.reconstructedExpression.field_2;
  tempResult.reconstructedExpression._M_string_length = 0;
  tempResult.reconstructedExpression.field_2._M_local_buf[0] = '\0';
  tempResult.lazyExpression.m_transientExpression = (ITransientExpression *)0x0;
  tempResult.lazyExpression.m_isNegated = false;
  tempResult.resultType = FatalErrorCondition;
  StringRef::operator_cast_to_string((string *)local_2b8,&message_local);
  std::__cxx11::string::operator=((string *)&tempResult,(string *)local_2b8);
  std::__cxx11::string::~string((string *)local_2b8);
  result.m_info.resultDisposition = (this->m_lastAssertionInfo).resultDisposition;
  result.m_info._52_4_ = *(undefined4 *)&(this->m_lastAssertionInfo).field_0x34;
  result.m_info.macroName.m_start = (this->m_lastAssertionInfo).macroName.m_start;
  result.m_info.macroName.m_size = (this->m_lastAssertionInfo).macroName.m_size;
  result.m_info.lineInfo.file = (this->m_lastAssertionInfo).lineInfo.file;
  result.m_info.lineInfo.line = (this->m_lastAssertionInfo).lineInfo.line;
  result.m_info.capturedExpression.m_start = (this->m_lastAssertionInfo).capturedExpression.m_start;
  result.m_info.capturedExpression.m_size = (this->m_lastAssertionInfo).capturedExpression.m_size;
  AssertionResultData::AssertionResultData(&result.m_resultData,&tempResult);
  assertionEnded(this,&result);
  handleUnfinishedSections(this);
  SectionInfo::SectionInfo
            (&testCaseSection,&(this->m_activeTestCase->super_TestCaseInfo).lineInfo,
             (string *)this->m_activeTestCase);
  assertions.passed = 0;
  assertions.failedButOk = 0;
  assertions.failed = 1;
  SectionStats::SectionStats(&testCaseSectionStats,&testCaseSection,&assertions,0.0,false);
  pIVar2 = (this->m_reporter)._M_t.
           super___uniq_ptr_impl<Catch::IStreamingReporter,_std::default_delete<Catch::IStreamingReporter>_>
           ._M_t.
           super__Tuple_impl<0UL,_Catch::IStreamingReporter_*,_std::default_delete<Catch::IStreamingReporter>_>
           .super__Head_base<0UL,_Catch::IStreamingReporter_*,_false>._M_head_impl;
  (*pIVar2->_vptr_IStreamingReporter[0xb])(pIVar2,&testCaseSectionStats);
  deltaTotals.error = 0;
  deltaTotals.testCases.failedButOk = 0;
  deltaTotals.assertions.passed = 0;
  deltaTotals.assertions.failedButOk = 0;
  deltaTotals.testCases.passed = 0;
  deltaTotals.testCases.failed = 1;
  deltaTotals.assertions.failed = 1;
  pIVar2 = (this->m_reporter)._M_t.
           super___uniq_ptr_impl<Catch::IStreamingReporter,_std::default_delete<Catch::IStreamingReporter>_>
           ._M_t.
           super__Tuple_impl<0UL,_Catch::IStreamingReporter_*,_std::default_delete<Catch::IStreamingReporter>_>
           .super__Head_base<0UL,_Catch::IStreamingReporter_*,_false>._M_head_impl;
  local_390._M_dataplus._M_p = (pointer)&local_390.field_2;
  local_390._M_string_length = 0;
  local_390.field_2._M_local_buf[0] = '\0';
  local_3b0._M_dataplus._M_p = (pointer)&local_3b0.field_2;
  local_3b0._M_string_length = 0;
  local_3b0.field_2._M_local_buf[0] = '\0';
  TestCaseStats::TestCaseStats
            ((TestCaseStats *)local_2b8,&this->m_activeTestCase->super_TestCaseInfo,&deltaTotals,
             &local_390,&local_3b0,false);
  (*pIVar2->_vptr_IStreamingReporter[0xc])(pIVar2,local_2b8);
  TestCaseStats::~TestCaseStats((TestCaseStats *)local_2b8);
  std::__cxx11::string::~string((string *)&local_3b0);
  std::__cxx11::string::~string((string *)&local_390);
  psVar1 = &(this->m_totals).testCases.failed;
  *psVar1 = *psVar1 + 1;
  local_2b8._0_8_ = local_2b8 + 0x10;
  local_2b8._8_8_ = (pointer)0x0;
  local_2b8[0x10] = '\0';
  testGroupEnded(this,(string *)local_2b8,&this->m_totals,1,1);
  std::__cxx11::string::~string((string *)local_2b8);
  pIVar2 = (this->m_reporter)._M_t.
           super___uniq_ptr_impl<Catch::IStreamingReporter,_std::default_delete<Catch::IStreamingReporter>_>
           ._M_t.
           super__Tuple_impl<0UL,_Catch::IStreamingReporter_*,_std::default_delete<Catch::IStreamingReporter>_>
           .super__Head_base<0UL,_Catch::IStreamingReporter_*,_false>._M_head_impl;
  TestRunStats::TestRunStats((TestRunStats *)local_2b8,&this->m_runInfo,&this->m_totals,false);
  (*pIVar2->_vptr_IStreamingReporter[0xe])(pIVar2,local_2b8);
  TestRunStats::~TestRunStats((TestRunStats *)local_2b8);
  SectionStats::~SectionStats(&testCaseSectionStats);
  SectionInfo::~SectionInfo(&testCaseSection);
  AssertionResultData::~AssertionResultData(&result.m_resultData);
  AssertionResultData::~AssertionResultData(&tempResult);
  return;
}

Assistant:

void RunContext::handleFatalErrorCondition( StringRef message ) {
        // First notify reporter that bad things happened
        m_reporter->fatalErrorEncountered(message);

        // Don't rebuild the result -- the stringification itself can cause more fatal errors
        // Instead, fake a result data.
        AssertionResultData tempResult( ResultWas::FatalErrorCondition, { false } );
        tempResult.message = static_cast<std::string>(message);
        AssertionResult result(m_lastAssertionInfo, tempResult);

        assertionEnded(result);

        handleUnfinishedSections();

        // Recreate section for test case (as we will lose the one that was in scope)
        auto const& testCaseInfo = m_activeTestCase->getTestCaseInfo();
        SectionInfo testCaseSection(testCaseInfo.lineInfo, testCaseInfo.name);

        Counts assertions;
        assertions.failed = 1;
        SectionStats testCaseSectionStats(testCaseSection, assertions, 0, false);
        m_reporter->sectionEnded(testCaseSectionStats);

        auto const& testInfo = m_activeTestCase->getTestCaseInfo();

        Totals deltaTotals;
        deltaTotals.testCases.failed = 1;
        deltaTotals.assertions.failed = 1;
        m_reporter->testCaseEnded(TestCaseStats(testInfo,
                                  deltaTotals,
                                  std::string(),
                                  std::string(),
                                  false));
        m_totals.testCases.failed++;
        testGroupEnded(std::string(), m_totals, 1, 1);
        m_reporter->testRunEnded(TestRunStats(m_runInfo, m_totals, false));
    }